

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

void ma_channel_map_apply_f32
               (float *pFramesOut,ma_channel *pChannelMapOut,ma_uint32 channelsOut,float *pFramesIn,
               ma_channel *pChannelMapIn,ma_uint32 channelsIn,ma_uint64 frameCount,
               ma_channel_mix_mode mode,ma_mono_expansion_mode monoExpansionMode)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ma_channel mVar7;
  byte bVar8;
  ma_channel_conversion_path mVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  undefined1 *puVar16;
  ma_uint64 mVar17;
  ulong uVar18;
  float fVar19;
  float weights [32] [32];
  ulong local_1078;
  undefined1 local_1038 [4104];
  
  uVar15 = (ulong)channelsIn;
  mVar9 = ma_channel_map_get_conversion_path
                    (pChannelMapIn,channelsIn,pChannelMapOut,channelsOut,ma_channel_mix_mode_default
                    );
  uVar10 = (ulong)channelsOut;
  if (mVar9 == ma_channel_conversion_path_mono_in) {
    if (frameCount != 0 &&
        (pFramesIn != (float *)0x0 && (channelsOut != 0 && pFramesOut != (float *)0x0))) {
      mVar17 = 0;
      do {
        uVar15 = 0;
        do {
          if (pChannelMapOut == (ma_channel *)0x0) {
            mVar7 = ma_channel_map_init_standard_channel
                              (ma_standard_channel_map_default,channelsOut,(ma_uint32)uVar15);
          }
          else {
            mVar7 = pChannelMapOut[uVar15];
          }
          if (mVar7 != '\0') {
            pFramesOut[uVar15] = *pFramesIn;
          }
          uVar15 = uVar15 + 1;
        } while (uVar10 != uVar15);
        pFramesIn = pFramesIn + 1;
        mVar17 = mVar17 + 1;
        pFramesOut = pFramesOut + uVar10;
      } while (mVar17 != frameCount);
    }
  }
  else if (mVar9 == ma_channel_conversion_path_mono_out) {
    if (channelsIn != 0 && (pFramesIn != (float *)0x0 && pFramesOut != (float *)0x0)) {
      uVar10 = 0;
      uVar14 = 0;
      do {
        if (pChannelMapIn == (ma_channel *)0x0) {
          mVar7 = ma_channel_map_init_standard_channel
                            (ma_standard_channel_map_default,channelsIn,(ma_uint32)uVar10);
        }
        else {
          mVar7 = pChannelMapIn[uVar10];
        }
        uVar14 = (uVar14 + 1) - (uint)(mVar7 == '\0');
        uVar10 = uVar10 + 1;
      } while (uVar15 != uVar10);
      if (uVar14 == 0) {
        for (uVar15 = frameCount << 2; uVar15 != 0; uVar15 = uVar15 - sVar11) {
          sVar11 = 0xffffffff;
          if (uVar15 < 0xffffffff) {
            sVar11 = uVar15;
          }
          memset(pFramesOut,0,sVar11);
          pFramesOut = (float *)((long)pFramesOut + sVar11);
        }
      }
      else if (frameCount != 0) {
        mVar17 = 0;
        do {
          fVar19 = 0.0;
          uVar10 = 0;
          do {
            if (pChannelMapIn == (ma_channel *)0x0) {
              mVar7 = ma_channel_map_init_standard_channel
                                (ma_standard_channel_map_default,channelsIn,(ma_uint32)uVar10);
            }
            else {
              mVar7 = pChannelMapIn[uVar10];
            }
            if (mVar7 != '\0') {
              fVar19 = fVar19 + pFramesIn[uVar10];
            }
            uVar10 = uVar10 + 1;
          } while (uVar15 != uVar10);
          *pFramesOut = fVar19 / (float)uVar14;
          pFramesOut = pFramesOut + 1;
          mVar17 = mVar17 + 1;
          pFramesIn = pFramesIn + uVar15;
        } while (mVar17 != frameCount);
      }
    }
  }
  else if (mVar9 == ma_channel_conversion_path_passthrough) {
    if (pFramesOut != pFramesIn) {
      for (uVar15 = (channelsOut << 2) * frameCount; uVar15 != 0; uVar15 = uVar15 - sVar11) {
        sVar11 = 0xffffffff;
        if (uVar15 < 0xffffffff) {
          sVar11 = uVar15;
        }
        memcpy(pFramesOut,pFramesIn,sVar11);
        pFramesOut = (float *)((long)pFramesOut + sVar11);
        pFramesIn = (float *)((long)pFramesIn + sVar11);
      }
    }
  }
  else if (channelsOut < 0xff) {
    if (channelsOut < 0x21 && channelsIn < 0x21) {
      if (channelsOut != 0) {
        puVar16 = local_1038;
        local_1078 = 0;
        do {
          if (pChannelMapOut == (ma_channel *)0x0) {
            bVar8 = ma_channel_map_init_standard_channel
                              (ma_standard_channel_map_default,channelsOut,(ma_uint32)local_1078);
          }
          else {
            bVar8 = pChannelMapOut[local_1078];
          }
          if (channelsIn != 0) {
            fVar19 = g_maChannelPlaneRatios[bVar8][0];
            fVar1 = g_maChannelPlaneRatios[bVar8][1];
            fVar2 = g_maChannelPlaneRatios[bVar8][2];
            fVar3 = g_maChannelPlaneRatios[bVar8][3];
            fVar4 = g_maChannelPlaneRatios[bVar8][4];
            fVar5 = g_maChannelPlaneRatios[bVar8][5];
            uVar18 = 0;
            do {
              if (pChannelMapIn == (ma_channel *)0x0) {
                bVar8 = ma_channel_map_init_standard_channel
                                  (ma_standard_channel_map_default,channelsIn,(ma_uint32)uVar18);
              }
              else {
                bVar8 = pChannelMapIn[uVar18];
              }
              *(float *)(puVar16 + uVar18 * 4) =
                   g_maChannelPlaneRatios[bVar8][5] * fVar5 +
                   g_maChannelPlaneRatios[bVar8][4] * fVar4 +
                   g_maChannelPlaneRatios[bVar8][3] * fVar3 +
                   g_maChannelPlaneRatios[bVar8][2] * fVar2 +
                   g_maChannelPlaneRatios[bVar8][0] * fVar19 +
                   g_maChannelPlaneRatios[bVar8][1] * fVar1;
              uVar18 = uVar18 + 1;
            } while (uVar15 != uVar18);
          }
          local_1078 = local_1078 + 1;
          puVar16 = puVar16 + 0x80;
        } while (local_1078 != uVar10);
      }
      if (frameCount != 0) {
        uVar18 = 0;
        do {
          if (channelsOut != 0) {
            uVar12 = 0;
            puVar16 = local_1038;
            do {
              fVar19 = 0.0;
              if (channelsIn != 0) {
                uVar13 = 0;
                do {
                  fVar19 = fVar19 + pFramesIn[uVar13] * *(float *)(puVar16 + uVar13 * 4);
                  uVar13 = uVar13 + 1;
                } while (uVar15 != uVar13);
              }
              pFramesOut[uVar12] = fVar19;
              uVar12 = uVar12 + 1;
              puVar16 = puVar16 + 0x80;
            } while (uVar12 != uVar10);
          }
          pFramesOut = pFramesOut + uVar10;
          uVar18 = (ulong)((int)uVar18 + 1);
          pFramesIn = pFramesIn + uVar15;
        } while (uVar18 < frameCount);
      }
    }
    else if (frameCount != 0) {
      uVar18 = 0;
      do {
        if (channelsOut != 0) {
          uVar12 = 0;
          do {
            if (pChannelMapOut == (ma_channel *)0x0) {
              bVar8 = ma_channel_map_init_standard_channel
                                (ma_standard_channel_map_default,channelsOut,(ma_uint32)uVar12);
            }
            else {
              bVar8 = pChannelMapOut[uVar12];
            }
            if (channelsIn == 0) {
              fVar19 = 0.0;
            }
            else {
              fVar1 = g_maChannelPlaneRatios[bVar8][0];
              fVar2 = g_maChannelPlaneRatios[bVar8][1];
              fVar3 = g_maChannelPlaneRatios[bVar8][2];
              fVar4 = g_maChannelPlaneRatios[bVar8][3];
              fVar5 = g_maChannelPlaneRatios[bVar8][4];
              fVar6 = g_maChannelPlaneRatios[bVar8][5];
              fVar19 = 0.0;
              uVar13 = 0;
              do {
                if (pChannelMapIn == (ma_channel *)0x0) {
                  bVar8 = ma_channel_map_init_standard_channel
                                    (ma_standard_channel_map_default,channelsIn,(ma_uint32)uVar13);
                }
                else {
                  bVar8 = pChannelMapIn[uVar13];
                }
                fVar19 = fVar19 + (g_maChannelPlaneRatios[bVar8][5] * fVar6 +
                                  g_maChannelPlaneRatios[bVar8][4] * fVar5 +
                                  g_maChannelPlaneRatios[bVar8][3] * fVar4 +
                                  g_maChannelPlaneRatios[bVar8][2] * fVar3 +
                                  g_maChannelPlaneRatios[bVar8][0] * fVar1 +
                                  g_maChannelPlaneRatios[bVar8][1] * fVar2) * pFramesIn[uVar13];
                uVar13 = uVar13 + 1;
              } while (uVar15 != uVar13);
            }
            pFramesOut[uVar12] = fVar19;
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar10);
        }
        pFramesOut = pFramesOut + uVar10;
        uVar18 = (ulong)((int)uVar18 + 1);
        pFramesIn = pFramesIn + uVar15;
      } while (uVar18 < frameCount);
    }
  }
  else {
    for (uVar15 = (channelsOut << 2) * frameCount; uVar15 != 0; uVar15 = uVar15 - sVar11) {
      sVar11 = 0xffffffff;
      if (uVar15 < 0xffffffff) {
        sVar11 = uVar15;
      }
      memset(pFramesOut,0,sVar11);
      pFramesOut = (float *)((long)pFramesOut + sVar11);
    }
  }
  return;
}

Assistant:

static void ma_channel_map_apply_f32(float* pFramesOut, const ma_channel* pChannelMapOut, ma_uint32 channelsOut, const float* pFramesIn, const ma_channel* pChannelMapIn, ma_uint32 channelsIn, ma_uint64 frameCount, ma_channel_mix_mode mode, ma_mono_expansion_mode monoExpansionMode)
{
    ma_channel_conversion_path conversionPath = ma_channel_map_get_conversion_path(pChannelMapIn, channelsIn, pChannelMapOut, channelsOut, mode);

    /* Optimized Path: Passthrough */
    if (conversionPath == ma_channel_conversion_path_passthrough) {
        ma_copy_pcm_frames(pFramesOut, pFramesIn, frameCount, ma_format_f32, channelsOut);
        return;
    }

    /* Special Path: Mono Output. */
    if (conversionPath == ma_channel_conversion_path_mono_out) {
        ma_channel_map_apply_mono_out_f32(pFramesOut, pFramesIn, pChannelMapIn, channelsIn, frameCount);
        return;
    }

    /* Special Path: Mono Input. */
    if (conversionPath == ma_channel_conversion_path_mono_in) {
        ma_channel_map_apply_mono_in_f32(pFramesOut, pChannelMapOut, channelsOut, pFramesIn, frameCount, monoExpansionMode);
        return;
    }

    /* Getting here means we aren't running on an optimized conversion path. */
    if (channelsOut <= MA_MAX_CHANNELS) {
        ma_result result;

        if (mode == ma_channel_mix_mode_simple) {
            ma_channel shuffleTable[MA_MAX_CHANNELS];

            result = ma_channel_map_build_shuffle_table(pChannelMapIn, channelsIn, pChannelMapOut, channelsOut, shuffleTable);
            if (result != MA_SUCCESS) {
                return;
            }

            result = ma_channel_map_apply_shuffle_table(pFramesOut, channelsOut, pFramesIn, channelsIn, frameCount, shuffleTable, ma_format_f32);
            if (result != MA_SUCCESS) {
                return;
            }
        } else {
            ma_uint32 iFrame;
            ma_uint32 iChannelOut;
            ma_uint32 iChannelIn;
            float weights[32][32];  /* Do not use MA_MAX_CHANNELS here! */

            /*
            If we have a small enough number of channels, pre-compute the weights. Otherwise we'll just need to
            fall back to a slower path because otherwise we'll run out of stack space.
            */
            if (channelsIn <= ma_countof(weights) && channelsOut <= ma_countof(weights)) {
                /* Pre-compute weights. */
                for (iChannelOut = 0; iChannelOut < channelsOut; iChannelOut += 1) {
                    ma_channel channelOut = ma_channel_map_get_channel(pChannelMapOut, channelsOut, iChannelOut);
                    for (iChannelIn = 0; iChannelIn < channelsIn; iChannelIn += 1) {
                        ma_channel channelIn = ma_channel_map_get_channel(pChannelMapIn, channelsIn, iChannelIn);
                        weights[iChannelOut][iChannelIn] = ma_calculate_channel_position_rectangular_weight(channelOut, channelIn);
                    }
                }

                for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                    for (iChannelOut = 0; iChannelOut < channelsOut; iChannelOut += 1) {
                        float accumulation = 0;

                        for (iChannelIn = 0; iChannelIn < channelsIn; iChannelIn += 1) {
                            accumulation += pFramesIn[iChannelIn] * weights[iChannelOut][iChannelIn];
                        }

                        pFramesOut[iChannelOut] = accumulation;
                    }

                    pFramesOut += channelsOut;
                    pFramesIn  += channelsIn;
                }
            } else {
                /* Cannot pre-compute weights because not enough room in stack-allocated buffer. */
                for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                    for (iChannelOut = 0; iChannelOut < channelsOut; iChannelOut += 1) {
                        float accumulation = 0;
                        ma_channel channelOut = ma_channel_map_get_channel(pChannelMapOut, channelsOut, iChannelOut);

                        for (iChannelIn = 0; iChannelIn < channelsIn; iChannelIn += 1) {
                            ma_channel channelIn = ma_channel_map_get_channel(pChannelMapIn, channelsIn, iChannelIn);
                            accumulation += pFramesIn[iChannelIn] * ma_calculate_channel_position_rectangular_weight(channelOut, channelIn);
                        }

                        pFramesOut[iChannelOut] = accumulation;
                    }

                    pFramesOut += channelsOut;
                    pFramesIn  += channelsIn;
                }
            }
        }
    } else {
        /* Fall back to silence. If you hit this, what are you doing with so many channels?! */
        ma_silence_pcm_frames(pFramesOut, frameCount, ma_format_f32, channelsOut);
    }
}